

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves.cpp
# Opt level: O0

void __thiscall linkedMoveList::deleteList(linkedMoveList *this)

{
  moveNode *pmVar1;
  moveNode *local_20;
  moveNode *temp;
  moveNode *cur;
  linkedMoveList *this_local;
  
  local_20 = this->head;
  pmVar1 = this->head;
  while (temp = pmVar1, local_20 != (moveNode *)0x0) {
    local_20 = temp->next;
    pmVar1 = local_20;
    if (temp != (moveNode *)0x0) {
      operator_delete(temp,0x10);
      pmVar1 = local_20;
    }
  }
  this->head = (moveNode *)0x0;
  this->tail = (moveNode *)0x0;
  return;
}

Assistant:

void linkedMoveList::deleteList(){
  moveNode *cur;
  moveNode *temp;
  cur = head;
	temp = head;
	while(temp != NULL){
    temp = cur->next;
		delete cur;
    cur = temp;
	}

  head = NULL;
  tail = NULL;
}